

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> * __thiscall
ELFIO::elfio::get_ordered_segments
          (vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *__return_storage_ptr__,
          elfio *this)

{
  elfio *peVar1;
  pointer puVar2;
  segment *psVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  _Elt_pointer ppsVar8;
  segment **ppsVar9;
  long lVar10;
  ulong uVar11;
  unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_> *seg;
  pointer puVar12;
  size_t i;
  ulong uVar13;
  long lVar14;
  long lVar15;
  segment *seg_1;
  deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> worklist;
  _Head_base<0UL,_ELFIO::segment_*,_false> local_90;
  _Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> local_88;
  
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::_M_initialize_map
            (&local_88,0);
  peVar1 = (this->segments).parent;
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::reserve
            (__return_storage_ptr__,
             (ulong)((uint)(*(int *)&(peVar1->segments_).
                                     super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->segments_).
                                    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff));
  peVar1 = (this->segments).parent;
  puVar12 = (peVar1->segments_).
            super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (peVar1->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar2) {
    do {
      local_90._M_head_impl =
           (puVar12->_M_t).
           super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
           super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
      std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*>
                ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&local_88,
                 &local_90._M_head_impl);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar2);
  }
  lVar14 = 0;
  uVar7 = 0;
  uVar13 = 0;
  while( true ) {
    if (((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x40 <= uVar13) break;
    if (uVar13 != uVar7) {
      lVar10 = (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_88._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
      uVar6 = lVar10 + uVar13;
      if (uVar6 < 0x40) {
        ppsVar9 = (segment **)
                  ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + lVar14);
      }
      else {
        uVar11 = uVar6 >> 6 | 0xfc00000000000000;
        if (0 < (long)uVar6) {
          uVar11 = uVar6 >> 6;
        }
        ppsVar9 = local_88._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                  lVar10 + uVar11 * -0x40 + uVar13;
      }
      cVar4 = (**(code **)(*(long *)*ppsVar9 + 0xc0))();
      if (cVar4 != '\0') {
        lVar10 = (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
                 (long)local_88._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
        uVar6 = lVar10 + uVar13;
        if (uVar6 < 0x40) {
          ppsVar9 = (segment **)
                    ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + lVar14);
        }
        else {
          uVar11 = uVar6 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar6) {
            uVar11 = uVar6 >> 6;
          }
          ppsVar9 = local_88._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                    lVar10 + uVar11 * -0x40 + uVar13;
        }
        lVar10 = (**(code **)(*(long *)*ppsVar9 + 0x88))();
        if (lVar10 == 0) {
          uVar6 = ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
                   (long)local_88._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar7;
          if (uVar6 < 0x40) {
            ppsVar8 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur + uVar7;
          }
          else {
            uVar11 = uVar6 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar6) {
              uVar11 = uVar6 >> 6;
            }
            ppsVar8 = local_88._M_impl.super__Deque_impl_data._M_start._M_node[uVar11] +
                      uVar6 + uVar11 * -0x40;
          }
          lVar10 = (**(code **)(*(long *)*ppsVar8 + 0x88))();
          lVar15 = uVar7 + (lVar10 == 0);
          lVar10 = (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
                   (long)local_88._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
          uVar7 = lVar10 + uVar13;
          if (uVar7 < 0x40) {
            ppsVar9 = (segment **)
                      ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + lVar14);
          }
          else {
            uVar6 = uVar7 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar7) {
              uVar6 = uVar7 >> 6;
            }
            ppsVar9 = local_88._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] +
                      lVar10 + uVar6 * -0x40 + uVar13;
          }
          uVar7 = lVar10 + lVar15;
          if (uVar7 < 0x40) {
            ppsVar8 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur + lVar15;
          }
          else {
            uVar6 = uVar7 >> 6 | 0xfc00000000000000;
            if (0 < (long)uVar7) {
              uVar6 = uVar7 >> 6;
            }
            ppsVar8 = local_88._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] +
                      uVar7 + uVar6 * -0x40;
          }
          psVar3 = *ppsVar9;
          *ppsVar9 = *ppsVar8;
          *ppsVar8 = psVar3;
          uVar7 = lVar15 + 1;
        }
      }
    }
    uVar13 = uVar13 + 1;
    lVar14 = lVar14 + 8;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_90._M_head_impl = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      lVar14 = 0;
      uVar13 = 0;
      while( true ) {
        if (((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
            ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
            ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
            * 0x40 <= uVar13) break;
        lVar10 = (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur -
                 (long)local_88._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
        uVar7 = lVar10 + uVar13;
        if (uVar7 < 0x40) {
          ppsVar9 = (segment **)
                    ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + lVar14);
        }
        else {
          uVar6 = uVar7 >> 6 | 0xfc00000000000000;
          if (0 < (long)uVar7) {
            uVar6 = uVar7 >> 6;
          }
          ppsVar9 = local_88._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] +
                    lVar10 + uVar6 * -0x40 + uVar13;
        }
        bVar5 = is_subsequence_of(local_90._M_head_impl,*ppsVar9);
        if (bVar5) break;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 8;
      }
      if (uVar13 < ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                   ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                   ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                    1) + (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                (_Map_pointer)0x0)) * 0x40) {
        std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*&>
                  ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&local_88,
                   &local_90._M_head_impl);
      }
      else {
        std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*&>
                  ((vector<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)__return_storage_ptr__
                   ,&local_90._M_head_impl);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~_Deque_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<segment*> get_ordered_segments() const
    {
        std::vector<segment*> res;
        std::deque<segment*>  worklist;

        res.reserve( segments.size() );
        for ( const auto& seg : segments ) {
            worklist.emplace_back( seg.get() );
        }

        // Bring the segments which start at address 0 to the front
        size_t nextSlot = 0;
        for ( size_t i = 0; i < worklist.size(); ++i ) {
            if ( i != nextSlot && worklist[i]->is_offset_initialized() &&
                 worklist[i]->get_offset() == 0 ) {
                if ( worklist[nextSlot]->get_offset() == 0 ) {
                    ++nextSlot;
                }
                std::swap( worklist[i], worklist[nextSlot] );
                ++nextSlot;
            }
        }

        while ( !worklist.empty() ) {
            segment* seg = worklist.front();
            worklist.pop_front();

            size_t i = 0;
            for ( ; i < worklist.size(); ++i ) {
                if ( is_subsequence_of( seg, worklist[i] ) ) {
                    break;
                }
            }

            if ( i < worklist.size() ) {
                worklist.emplace_back( seg );
            }
            else {
                res.emplace_back( seg );
            }
        }

        return res;
    }